

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR CorUnix::CPalSynchronizationManager::WakeUpLocalThread
                    (CPalThread *pthrCurrent,CPalThread *pthrTarget,
                    ThreadWakeupReason twrWakeupReason,DWORD dwObjectIndex)

{
  LONG LVar1;
  ThreadNativeWaitData *ptnwdNativeWaitData_00;
  ThreadNativeWaitData *ptnwdNativeWaitData;
  PAL_ERROR palErr;
  DWORD dwObjectIndex_local;
  ThreadWakeupReason twrWakeupReason_local;
  CPalThread *pthrTarget_local;
  CPalThread *pthrCurrent_local;
  
  ptnwdNativeWaitData_00 =
       CThreadSynchronizationInfo::GetNativeData(&pthrTarget->synchronizationInfo);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  ptnwdNativeWaitData_00->twrWakeupReason = twrWakeupReason;
  ptnwdNativeWaitData_00->dwObjectIndex = dwObjectIndex;
  LVar1 = GetLocalSynchLockCount(pthrCurrent);
  if (LVar1 < 1) {
    ptnwdNativeWaitData._4_4_ = SignalThreadCondition(ptnwdNativeWaitData_00);
  }
  else {
    ptnwdNativeWaitData._4_4_ = DeferThreadConditionSignaling(pthrCurrent,pthrTarget);
  }
  return ptnwdNativeWaitData._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::WakeUpLocalThread(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget,
        ThreadWakeupReason twrWakeupReason,
        DWORD dwObjectIndex)
    {
        PAL_ERROR palErr = NO_ERROR;
        ThreadNativeWaitData * ptnwdNativeWaitData =
            pthrTarget->synchronizationInfo.GetNativeData();

        TRACE("Waking up a local thread [WakeUpReason=%u ObjectIndex=%u "
              "ptnwdNativeWaitData=%p]\n", twrWakeupReason, dwObjectIndex,
              ptnwdNativeWaitData);

        // Set wakeup reason and signaled object index
        ptnwdNativeWaitData->twrWakeupReason = twrWakeupReason;
        ptnwdNativeWaitData->dwObjectIndex   = dwObjectIndex;

#if SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING
        if (0 < GetLocalSynchLockCount(pthrCurrent))
        {
            // Defer the actual thread signaling to right after
            // releasing the synch lock(s), so that signaling
            // can happen from a thread-suspension safe area
            palErr = DeferThreadConditionSignaling(pthrCurrent, pthrTarget);
        }
        else
        {
            // Signal the target thread's condition
            palErr = SignalThreadCondition(ptnwdNativeWaitData);
        }
#else // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING
        // Signal the target thread's condition
        palErr = SignalThreadCondition(ptnwdNativeWaitData);
#endif // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING

        return palErr;
    }